

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O2

REF_STATUS ref_import_meshb_header(char *filename,REF_INT *version,REF_FILEPOS *key_pos)

{
  REF_FILEPOS RVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  FILE *__stream;
  size_t sVar5;
  __off_t _Var6;
  undefined8 uVar7;
  char *pcVar8;
  undefined8 uStackY_60;
  uint local_44;
  int int_version;
  int int_code;
  REF_FILEPOS next_position;
  
  for (lVar4 = 0; lVar4 != 0x9c; lVar4 = lVar4 + 1) {
    key_pos[lVar4] = -1;
  }
  local_44 = 0x9c;
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x587,
           "ref_import_meshb_header","unable to open file");
    return 2;
  }
  sVar5 = fread(&int_code,4,1,__stream);
  if (sVar5 == 1) {
    sVar5 = (size_t)int_code;
    if (sVar5 == 1) {
      sVar5 = fread(&int_version,4,1,__stream);
      if (sVar5 == 1) {
        if (int_version - 5U < 0xfffffffc) {
          printf("version %d not supported\n");
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x58e,"ref_import_meshb_header","version");
          return 1;
        }
        *version = int_version;
        next_position = ftello(__stream);
        iVar2 = fseeko(__stream,0,2);
        if (iVar2 == 0) {
          _Var6 = ftello(__stream);
          while( true ) {
            RVar1 = next_position;
            if ((_Var6 < next_position) || (next_position == 0)) {
              fclose(__stream);
              return 0;
            }
            iVar2 = fseeko(__stream,next_position,0);
            if (iVar2 != 0) break;
            sVar5 = fread(&local_44,4,1,__stream);
            if (sVar5 != 1) {
              pcVar8 = "keyword code";
              uStackY_60 = 1;
              uVar7 = 0x5a6;
              goto LAB_00129ba1;
            }
            if ((ulong)local_44 < 0x9c) {
              key_pos[local_44] = RVar1;
            }
            else {
              printf("ignoring keyword %d\n");
            }
            uVar3 = meshb_pos((FILE *)__stream,*version,&next_position);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x5ac,"ref_import_meshb_header",(ulong)uVar3,"pos");
              return 1;
            }
          }
          pcVar8 = "fseeko NEXT failed";
          uVar7 = 0x597;
        }
        else {
          pcVar8 = "fseeko END failed";
          uVar7 = 0x593;
        }
        sVar5 = (size_t)iVar2;
        uStackY_60 = 0;
      }
      else {
        pcVar8 = "version";
        uStackY_60 = 1;
        uVar7 = 0x58b;
      }
    }
    else {
      pcVar8 = "code";
      uStackY_60 = 1;
      uVar7 = 0x58a;
    }
  }
  else {
    pcVar8 = "code";
    uStackY_60 = 1;
    uVar7 = 0x589;
  }
LAB_00129ba1:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar7,
         "ref_import_meshb_header",pcVar8,uStackY_60,sVar5);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_import_meshb_header(const char *filename,
                                           REF_INT *version,
                                           REF_FILEPOS *key_pos) {
  FILE *file;
  int int_code, int_version;
  REF_INT keyword_code;
  REF_FILEPOS position, next_position, end_position;

  for (keyword_code = 0; keyword_code < REF_IMPORT_MESHB_LAST_KEYWORD;
       keyword_code++)
    key_pos[keyword_code] = REF_EMPTY;

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(1, fread((unsigned char *)&int_code, 4, 1, file), "code");
  REIS(1, int_code, "code");
  REIS(1, fread((unsigned char *)&int_version, 4, 1, file), "version");
  if (int_version < 1 || 4 < int_version) {
    printf("version %d not supported\n", int_version);
    THROW("version");
  }
  *version = (REF_INT)int_version;

  next_position = ftello(file);
  REIS(0, fseeko(file, 0, SEEK_END), "fseeko END failed");
  end_position = ftello(file);
  while (next_position <= end_position && 0 != next_position) {
    position = next_position;
    REIS(0, fseeko(file, position, SEEK_SET), "fseeko NEXT failed");
    /*
#include <inttypes.h>
    , {
      printf("end_position = %jd\n", (intmax_t)end_position);
      printf("next_position = %jd\n", (intmax_t)next_position);
      for (keyword_code = 0; keyword_code < REF_IMPORT_MESHB_LAST_KEYWORD;
           keyword_code++) {
        if (REF_EMPTY != key_pos[keyword_code]) {
          printf("key_pos[%d] = %jd\n", keyword_code,
                 (intmax_t)key_pos[keyword_code]);
        }
      }
    });
    */
    REIS(1, fread((unsigned char *)&keyword_code, 4, 1, file), "keyword code");
    if (0 <= keyword_code && keyword_code < REF_IMPORT_MESHB_LAST_KEYWORD) {
      key_pos[keyword_code] = position;
    } else {
      printf("ignoring keyword %d\n", keyword_code);
    }
    RSS(meshb_pos(file, *version, &next_position), "pos");
  }

  fclose(file);
  return REF_SUCCESS;
}